

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping.c
# Opt level: O1

int ping(void)

{
  bool bVar1;
  OdometryPtr p_Var2;
  ulong uVar3;
  
  uVar3 = 0;
  yprintf(OUTPUT_LV_INFO,"Ping request: 0x%08x\n",0x123456);
  p_Var2 = get_odometry_ptr();
  p_Var2->ping_response[0] = 0;
  p_Var2->ping_response[1] = 0;
  p_Var2->ping_response[2] = 0;
  p_Var2->ping_response[3] = 0;
  p_Var2->ping_response[4] = 0;
  p_Var2->ping_response[5] = 0;
  p_Var2->ping_response[6] = 0;
  p_Var2->ping_response[7] = 0;
  p_Var2->ping_response[8] = 0;
  p_Var2->ping_response[9] = 0;
  p_Var2->ping_response[10] = 0;
  p_Var2->ping_response[0xb] = 0;
  p_Var2->ping_response[0xc] = 0;
  p_Var2->ping_response[0xd] = 0;
  p_Var2->ping_response[0xe] = 0;
  p_Var2->ping_response[0xf] = 0;
  p_Var2->ping_response[0x10] = 0;
  parameter_set('@','~',0);
  parameter_set('e','~',0x123456);
  odometry_receive_loop();
  bVar1 = true;
  do {
    if (p_Var2->ping_response[uVar3] == 0x123456) {
      bVar1 = false;
      yprintf(OUTPUT_LV_INFO,"Ping response from ID: %d\n",uVar3 & 0xffffffff);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x10);
  if (p_Var2->ping_response[0x10] == 0x123456) {
    bVar1 = false;
    yprintf(OUTPUT_LV_INFO,"Ping response from device without ID\n");
  }
  if (bVar1) {
    yprintf(OUTPUT_LV_ERROR,"No ping response!\n");
  }
  return 1;
}

Assistant:

int ping()
{
  const int data = 0x123456;
  yprintf(OUTPUT_LV_INFO, "Ping request: 0x%08x\n", data);

  OdometryPtr odom = get_odometry_ptr();
  int i;
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM + 1; i++)
    odom->ping_response[i] = 0;

  const char target = MOTOR_ID_BROADCAST;
  parameter_set(PARAM_servo, target, 0);
  parameter_set(PARAM_ping, target, data);
  odometry_receive_loop();

  int ret = 1;
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (odom->ping_response[i] == data)
    {
      ret = 0;
      yprintf(OUTPUT_LV_INFO, "Ping response from ID: %d\n", i);
    }
  }
  if (odom->ping_response[i] == data)
  {
    ret = 0;
    yprintf(OUTPUT_LV_INFO, "Ping response from device without ID\n");
  }
  if (ret)
  {
    yprintf(OUTPUT_LV_ERROR, "No ping response!\n");
  }

  return 1;
}